

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

uint8 * __thiscall
google::protobuf::internal::ExtensionSet::Extension::
InternalSerializeMessageSetItemWithCachedSizesToArray
          (Extension *this,int number,uint8 *target,EpsCopyOutputStream *stream)

{
  Arena *pAVar1;
  uint32 value;
  LogMessage *other;
  uint64 extraout_RDX;
  uint8 *puVar2;
  uint8 *target_00;
  LogFinisher local_69;
  uint8 *local_68;
  LogMessage local_60;
  
  local_68 = target;
  if ((this->type == '\v') && (this->is_repeated != true)) {
    if ((this->field_0xa & 1) == 0) {
      io::EpsCopyOutputStream::EnsureSpace(stream,&local_68);
      *local_68 = '\v';
      local_68[1] = '\x10';
      puVar2 = local_68 + 2;
      local_68 = local_68 + 1;
      local_68 = io::CodedOutputStream::WriteVarint32ToArray(number,puVar2);
      pAVar1 = (Arena *)(this->field_0).repeated_string_value;
      if ((this->field_0xa & 0x10) == 0) {
        *local_68 = '\x1a';
        target_00 = local_68 + 1;
        value = (*(code *)(pAVar1->impl_).threads_._M_b._M_p[1].cleanup_)
                          (pAVar1,puVar2,extraout_RDX);
        puVar2 = io::CodedOutputStream::WriteVarint32ToArray(value,target_00);
        local_68 = (uint8 *)(*(code *)(pAVar1->impl_).threads_._M_b._M_p[1].ptr_)
                                      (pAVar1,puVar2,stream);
      }
      else {
        local_68 = (uint8 *)(*(code *)(pAVar1->impl_).threads_._M_b._M_p[1].cleanup_limit_)
                                      (pAVar1,3,local_68,stream);
      }
      io::EpsCopyOutputStream::EnsureSpace(stream,&local_68);
      *local_68 = '\f';
      target = local_68 + 1;
    }
  }
  else {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_WARNING,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/extension_set.cc"
               ,0x81f);
    other = LogMessage::operator<<(&local_60,"Invalid message set extension.");
    LogFinisher::operator=(&local_69,other);
    LogMessage::~LogMessage(&local_60);
    target = InternalSerializeFieldWithCachedSizesToArray(this,number,target,stream);
  }
  return target;
}

Assistant:

uint8*
ExtensionSet::Extension::InternalSerializeMessageSetItemWithCachedSizesToArray(
    int number, uint8* target, io::EpsCopyOutputStream* stream) const {
  if (type != WireFormatLite::TYPE_MESSAGE || is_repeated) {
    // Not a valid MessageSet extension, but serialize it the normal way.
    GOOGLE_LOG(WARNING) << "Invalid message set extension.";
    return InternalSerializeFieldWithCachedSizesToArray(number, target, stream);
  }

  if (is_cleared) return target;

  stream->EnsureSpace(&target);
  // Start group.
  target = io::CodedOutputStream::WriteTagToArray(
      WireFormatLite::kMessageSetItemStartTag, target);
  // Write type ID.
  target = WireFormatLite::WriteUInt32ToArray(
      WireFormatLite::kMessageSetTypeIdNumber, number, target);
  // Write message.
  if (is_lazy) {
    target = lazymessage_value->WriteMessageToArray(
        WireFormatLite::kMessageSetMessageNumber, target, stream);
  } else {
    target = WireFormatLite::InternalWriteMessageToArray(
        WireFormatLite::kMessageSetMessageNumber, *message_value, target,
        stream);
  }
  // End group.
  stream->EnsureSpace(&target);
  target = io::CodedOutputStream::WriteTagToArray(
      WireFormatLite::kMessageSetItemEndTag, target);
  return target;
}